

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileStream.cpp
# Opt level: O3

void __thiscall
TPZFileStream::WriteData<TFad<6,double>>(TPZFileStream *this,TFad<6,_double> *p,int howMany)

{
  ostream *poVar1;
  long lVar2;
  
  if (0 < howMany) {
    lVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)p->dx_ + lVar2 + -8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)howMany << 6 != lVar2);
  }
  return;
}

Assistant:

void  TPZFileStream::WriteData(const T *p, int howMany){
        for(int c=0; c<howMany; c++) fOut << p[c] << std::endl;
#ifdef PZDEBUG
        if (fOut.bad()) {
            PZError << "TFileStream:Could not write to stream" << std::endl;
            DebugStop();
        }
#endif
    }